

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O0

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::InnerMap::DestroyNode(InnerMap *this,Node *node)

{
  Node *node_local;
  InnerMap *this_local;
  
  Map<std::__cxx11::string,std::__cxx11::string>::
  MapAllocator<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>::
  destroy<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>
            ((MapAllocator<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::KeyValuePair>
              *)&this->alloc_,&node->kv);
  Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::
  Dealloc<google::protobuf::Map<std::__cxx11::string,std::__cxx11::string>::InnerMap::Node>
            ((InnerMap *)this,node,1);
  return;
}

Assistant:

void DestroyNode(Node* node) {
      alloc_.destroy(&node->kv);
      Dealloc<Node>(node, 1);
    }